

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool player_book_has_unlearned_spells(player *p)

{
  _Bool _Var1;
  int iVar2;
  wchar_t wVar3;
  object **item_list_00;
  class_book_conflict *pcVar4;
  class_book_conflict *book;
  wchar_t item_num;
  object **item_list;
  int local_20;
  wchar_t item_max;
  wchar_t j;
  wchar_t i;
  player *p_local;
  
  iVar2 = (uint)z_info->pack_size + (uint)z_info->floor_size;
  item_list_00 = (object **)mem_zalloc((long)iVar2 << 3);
  if (p->upkeep->new_spells == L'\0') {
    mem_free(item_list_00);
  }
  else {
    wVar3 = scan_items(item_list_00,(long)iVar2,p,L'\x06',obj_can_study);
    for (item_max = L'\0'; item_max < wVar3; item_max = item_max + L'\x01') {
      pcVar4 = player_object_to_book(p,item_list_00[item_max]);
      if (pcVar4 != (class_book_conflict *)0x0) {
        for (local_20 = 0; local_20 < pcVar4->num_spells; local_20 = local_20 + 1) {
          _Var1 = spell_okay_to_study(p,pcVar4->spells[local_20].sidx);
          if (_Var1) {
            mem_free(item_list_00);
            return true;
          }
        }
      }
    }
    mem_free(item_list_00);
  }
  return false;
}

Assistant:

bool player_book_has_unlearned_spells(struct player *p)
{
	int i, j;
	int item_max = z_info->pack_size + z_info->floor_size;
	struct object **item_list = mem_zalloc(item_max * sizeof(struct object *));
	int item_num;

	/* Check if the player can learn new spells */
	if (!p->upkeep->new_spells) {
		mem_free(item_list);
		return false;
	}

	/* Check through all available books */
	item_num = scan_items(item_list, item_max, p, USE_INVEN | USE_FLOOR,
		obj_can_study);
	for (i = 0; i < item_num; i++) {
		const struct class_book *book = player_object_to_book(p, item_list[i]);
		if (!book) continue;

		/* Extract spells */
		for (j = 0; j < book->num_spells; j++)
			if (spell_okay_to_study(p, book->spells[j].sidx)) {
				/* There is a spell the player can study */
				mem_free(item_list);
				return true;
			}
	}

	mem_free(item_list);
	return false;
}